

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack24_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar1 = *in;
  uVar2 = in[0x15];
  *out = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar7);
  auVar5._8_8_ = 0x1000000018;
  auVar5._0_8_ = 0x1000000018;
  auVar8 = vpsrlvd_avx2(auVar4,auVar5);
  auVar6._8_8_ = 0x1000000008;
  auVar6._0_8_ = 0x1000000008;
  auVar4 = vpsllvd_avx2(auVar7,auVar6);
  auVar4 = vpternlogd_avx512vl(auVar4,auVar8,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 1) = auVar4._0_8_;
  out[3] = (uint)(uVar3 >> 0x28);
  uVar1 = in[3];
  out[4] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 4);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar9);
  auVar8 = vpsllvd_avx2(auVar9,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 5) = auVar4._0_8_;
  out[7] = (uint)(uVar3 >> 0x28);
  uVar1 = in[6];
  out[8] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 7);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar10);
  auVar8 = vpsllvd_avx2(auVar10,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar7 = ZEXT816(0xff000000ffff00);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,auVar7,0xec);
  *(long *)(out + 9) = auVar4._0_8_;
  out[0xb] = (uint)(uVar3 >> 0x28);
  uVar1 = in[9];
  out[0xc] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar11);
  auVar8 = vpsllvd_avx2(auVar11,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,auVar7,0xec);
  *(long *)(out + 0xd) = auVar4._0_8_;
  out[0xf] = (uint)(uVar3 >> 0x28);
  uVar1 = in[0xc];
  out[0x10] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 0xd);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar12);
  auVar8 = vpsllvd_avx2(auVar12,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,auVar7,0xec);
  *(long *)(out + 0x11) = auVar4._0_8_;
  out[0x13] = (uint)(uVar3 >> 0x28);
  uVar1 = in[0xf];
  out[0x14] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 0x10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar13);
  auVar8 = vpsllvd_avx2(auVar13,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,auVar7,0xec);
  *(long *)(out + 0x15) = auVar4._0_8_;
  out[0x17] = (uint)(uVar3 >> 0x28);
  uVar1 = in[0x12];
  out[0x18] = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 0x13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar14);
  auVar8 = vpsllvd_avx2(auVar14,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 0x19) = auVar4._0_8_;
  out[0x1b] = (uint)(uVar3 >> 0x28);
  out[0x1c] = uVar2 & 0xffffff;
  uVar3 = *(ulong *)(in + 0x16);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar2),auVar8);
  auVar8 = vpsllvd_avx2(auVar8,auVar6);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpternlogd_avx512vl(auVar8,auVar4,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 0x1d) = auVar4._0_8_;
  out[0x1f] = (uint)(uVar3 >> 0x28);
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack24_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;

  return in;
}